

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_case21.c
# Opt level: O1

void case21_set_ext_params(xc_func_type *p,double *ext_params)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  int iVar8;
  
  puVar1 = (undefined8 *)p->params;
  *puVar1 = 0xa00000003;
  auVar2 = _DAT_00f842c0;
  uVar4 = 0x100000000;
  lVar3 = 1;
  dVar5 = (double)DAT_00f842c0;
  dVar6 = DAT_00f842c0._8_8_;
  do {
    iVar8 = (int)(uVar4 >> 0x20);
    auVar7._0_8_ = uVar4 & 0xffffffff;
    auVar7._8_4_ = iVar8;
    auVar7._12_4_ = 0;
    puVar1[lVar3] = (SUB168(auVar7 | auVar2,0) - dVar5) * 0.14285714285714285 + -0.42857142857142855
    ;
    (puVar1 + lVar3)[1] =
         (SUB168(auVar7 | auVar2,8) - dVar6) * 0.14285714285714285 + -0.42857142857142855;
    uVar4 = CONCAT44(iVar8 + 2,(int)uVar4 + 2);
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0xf);
  lVar3 = 0;
  do {
    puVar1[lVar3 + 0xf] = ext_params[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10);
  lVar3 = 0;
  do {
    puVar1[lVar3 + 0x19] = ext_params[lVar3 + 10];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10);
  puVar1[0x23] = ext_params[0x14];
  puVar1[0x24] = ext_params[0x15];
  puVar1[0x25] = ext_params[0x16];
  set_ext_params_exx(p,ext_params);
  return;
}

Assistant:

static void
case21_set_ext_params(xc_func_type *p, const double *ext_params)
{
  assert(p != NULL);
  hyb_gga_xc_case21_params * params = (hyb_gga_xc_case21_params *) p->params;

  /* Set internal parameters */
  params->k = 3;
  params->Nsp = 10;
  double qmin = -params->k*1.0/(params->Nsp - params->k);
  double qmax = params->Nsp*1.0/(params->Nsp - params->k);
  int nknots = params->Nsp + params->k + 1;
  double dq  = (qmax - qmin)/(nknots-1);
  for(int k=0; k<nknots; k++) {
    params->knots[k] = qmin+k*dq;
  }

  /* External parameters */
  for(int i=0;i<params->Nsp;i++)
    params->cx[i] = ext_params[i];
  for(int i=0;i<params->Nsp;i++)
    params->cc[i] = ext_params[i + params->Nsp];
  params->gammax = ext_params[2*params->Nsp];
  params->gammac = ext_params[2*params->Nsp+1];
  params->ax = ext_params[2*params->Nsp+2];

  /* Exact exchange */
  set_ext_params_exx(p, ext_params);
}